

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

short * __thiscall delay_line<short>::input_buffer(delay_line<short> *this,uint32_t frames_needed)

{
  ulong uVar1;
  
  uVar1 = (this->delay_input_buffer).length_;
  this->leftover_samples = (uint32_t)uVar1;
  auto_array<short>::reserve
            (&this->delay_input_buffer,
             (ulong)(this->super_processor).channels * (ulong)frames_needed + (uVar1 & 0xffffffff));
  return (this->delay_input_buffer).data_ + this->leftover_samples;
}

Assistant:

T * input_buffer(uint32_t frames_needed)
  {
    leftover_samples = delay_input_buffer.length();
    delay_input_buffer.reserve(leftover_samples +
                               frames_to_samples(frames_needed));
    return delay_input_buffer.data() + leftover_samples;
  }